

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O0

void __thiscall QPDFArgParser::doFinalChecks(QPDFArgParser *this)

{
  option_table_t *poVar1;
  bool bVar2;
  element_type *peVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  QPDFArgParser *local_10;
  QPDFArgParser *this_local;
  
  local_10 = this;
  peVar3 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  poVar1 = peVar3->option_table;
  peVar3 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if (poVar1 != &peVar3->main_option_table) {
    QTC::TC("libtests","QPDFArgParser missing --",0);
    peVar3 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::operator+(&local_50,"missing -- at end of ",&peVar3->option_table_name);
    std::operator+(&local_30,&local_50," options");
    usage(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  peVar3 = std::
           __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  bVar2 = std::operator!=(&peVar3->final_check_handler,(nullptr_t)0x0);
  if (bVar2) {
    peVar3 = std::
             __shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    std::function<void_()>::operator()(&peVar3->final_check_handler);
  }
  return;
}

Assistant:

void
QPDFArgParser::doFinalChecks()
{
    if (m->option_table != &(m->main_option_table)) {
        QTC::TC("libtests", "QPDFArgParser missing --");
        usage("missing -- at end of " + m->option_table_name + " options");
    }
    if (m->final_check_handler != nullptr) {
        m->final_check_handler();
    }
}